

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_rwkv_wkv6(ggml_context *ctx,ggml_tensor *k,ggml_tensor *v,ggml_tensor *r,ggml_tensor *tf,
              ggml_tensor *td,ggml_tensor *state)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Bool _Var5;
  ggml_tensor *pgVar6;
  char *pcVar7;
  int line;
  int64_t ne [4];
  
  _Var5 = ggml_is_contiguous_0(k);
  if (_Var5) {
    _Var5 = ggml_is_contiguous_0(v);
    if (_Var5) {
      _Var5 = ggml_is_contiguous_0(r);
      if (_Var5) {
        _Var5 = ggml_is_contiguous_0(tf);
        if (_Var5) {
          _Var5 = ggml_is_contiguous_0(td);
          if (_Var5) {
            _Var5 = ggml_is_contiguous_0(state);
            if (_Var5) {
              lVar1 = k->ne[0];
              if (((v->ne[0] == lVar1) && (lVar2 = k->ne[1], v->ne[1] == lVar2)) &&
                 (lVar3 = k->ne[2], v->ne[2] == lVar3)) {
                if (((r->ne[0] == lVar1) && (r->ne[1] == lVar2)) && (r->ne[2] == lVar3)) {
                  if (((td->ne[0] == lVar1) && (td->ne[1] == lVar2)) && (td->ne[2] == lVar3)) {
                    lVar4 = state->ne[1];
                    ne[0] = lVar2 * lVar1;
                    if (state->ne[0] * lVar4 * state->ne[2] * state->ne[3] - ne[0] * lVar1 * lVar4
                        == 0) {
                      ne[1] = lVar4 * lVar1 + lVar3;
                      ne[2] = 1;
                      ne[3] = 1;
                      pgVar6 = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
                      pgVar6->op = GGML_OP_RWKV_WKV6;
                      pgVar6->src[0] = k;
                      pgVar6->src[1] = v;
                      pgVar6->src[2] = r;
                      pgVar6->src[3] = tf;
                      pgVar6->src[4] = td;
                      pgVar6->src[5] = state;
                      return pgVar6;
                    }
                    pcVar7 = "ggml_nelements(state) == S * S * H * n_seqs";
                    line = 0x128b;
                  }
                  else {
                    pcVar7 = "td->ne[0] == S && td->ne[1] == H && td->ne[2] == n_tokens";
                    line = 0x128a;
                  }
                }
                else {
                  pcVar7 = "r->ne[0] == S && r->ne[1] == H && r->ne[2] == n_tokens";
                  line = 0x1289;
                }
              }
              else {
                pcVar7 = "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens";
                line = 0x1288;
              }
            }
            else {
              pcVar7 = "ggml_is_contiguous(state)";
              line = 0x1281;
            }
          }
          else {
            pcVar7 = "ggml_is_contiguous(td)";
            line = 0x1280;
          }
        }
        else {
          pcVar7 = "ggml_is_contiguous(tf)";
          line = 0x127f;
        }
      }
      else {
        pcVar7 = "ggml_is_contiguous(r)";
        line = 0x127e;
      }
    }
    else {
      pcVar7 = "ggml_is_contiguous(v)";
      line = 0x127d;
    }
  }
  else {
    pcVar7 = "ggml_is_contiguous(k)";
    line = 0x127c;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

struct ggml_tensor * ggml_rwkv_wkv6(
        struct ggml_context * ctx,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * r,
        struct ggml_tensor  * tf,
        struct ggml_tensor  * td,
        struct ggml_tensor  * state) {
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(r));
    GGML_ASSERT(ggml_is_contiguous(tf));
    GGML_ASSERT(ggml_is_contiguous(td));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(r->ne[0] == S && r->ne[1] == H && r->ne[2] == n_tokens);
        GGML_ASSERT(td->ne[0] == S && td->ne[1] == H && td->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_RWKV_WKV6;
    result->src[0] = k;
    result->src[1] = v;
    result->src[2] = r;
    result->src[3] = tf;
    result->src[4] = td;
    result->src[5] = state;

    return result;
}